

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Expression * __thiscall
soul::ResolutionPass::ConstantFolder::visit(ConstantFolder *this,FunctionCall *c)

{
  pool_ptr<soul::AST::CommaSeparatedList> *this_00;
  pool_ref<soul::AST::Expression> *e;
  undefined1 uVar1;
  pool_ref<soul::AST::Expression> *ppVar2;
  VariableDeclaration *this_01;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  CommaSeparatedList *pCVar6;
  Constant *pCVar7;
  FunctionCall *pFVar8;
  long lVar9;
  FunctionCall *pFVar10;
  ArrayView<soul::Value> args;
  pool_ptr<soul::AST::Constant> constant;
  Type paramType;
  Value local_200;
  Value local_1c0;
  CompileMessage local_180;
  undefined1 local_148 [8];
  size_t local_140;
  RefCountedPtr<soul::Structure> local_138;
  Value local_130 [4];
  
  sVar5 = AST::CallOrCastBase::getNumArguments(&c->super_CallOrCastBase);
  if (sVar5 != 0) {
    pFVar10 = (FunctionCall *)
              (c->targetFunction->parameters).
              super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).field_0x31;
    this_00 = &(c->super_CallOrCastBase).arguments;
    pCVar6 = pool_ptr<soul::AST::CommaSeparatedList>::operator->(this_00);
    ppVar2 = (pCVar6->items).items;
    sVar5 = (pCVar6->items).numActive;
    for (lVar9 = 0; sVar5 << 3 != lVar9; lVar9 = lVar9 + 8) {
      this_01 = *(VariableDeclaration **)
                 ((long)&(pFVar10->super_CallOrCastBase).super_Expression.super_Statement.
                         super_ASTObject._vptr_ASTObject + lVar9);
      bVar3 = AST::VariableDeclaration::isResolved(this_01);
      if (bVar3) {
        AST::VariableDeclaration::getType((Type *)local_148,this_01);
        e = (pool_ref<soul::AST::Expression> *)((long)&ppVar2->object + lVar9);
        (this->super_ErrorIgnoringRewritingASTVisitor).field_0x31 = local_148[2];
        if ((((local_148[2] == true) && (((ulong)local_148 & 0x1000000) == 0)) &&
            (e->object->kind == value)) &&
           ((iVar4 = (*(e->object->super_Statement).super_ASTObject._vptr_ASTObject[3])(),
            (char)iVar4 != '\0' &&
            (iVar4 = (*(e->object->super_Statement).super_ASTObject._vptr_ASTObject[0xf])(),
            (char)iVar4 == '\0')))) {
          lVar9 = *(long *)((long)&ppVar2->object + lVar9);
          Errors::cannotPassConstAsNonConstRef<>();
          AST::Context::throwError((Context *)(lVar9 + 0x10),&local_180,false);
        }
        RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e);
        RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_138);
      }
    }
    (this->super_ErrorIgnoringRewritingASTVisitor).field_0x31 = uVar1;
    if (c->targetFunction->intrinsic != none) {
      local_148 = (undefined1  [8])local_130;
      local_140 = 0;
      local_138.object = (Structure *)0x4;
      if (this_00->object != (CommaSeparatedList *)0x0) {
        pCVar6 = pool_ptr<soul::AST::CommaSeparatedList>::operator->(this_00);
        ppVar2 = (pCVar6->items).items;
        pFVar10 = (FunctionCall *)((pCVar6->items).numActive << 3);
        pFVar8 = (FunctionCall *)0x0;
        while ((pFVar10 != pFVar8 &&
               ((**(code **)(**(long **)((long)&ppVar2->object +
                                        (long)&(pFVar8->super_CallOrCastBase).super_Expression) +
                            0x68))(&local_200),
               CONCAT71(local_200.type._1_7_,local_200.type.category) != 0))) {
          pCVar7 = pool_ptr<soul::AST::Constant>::operator->
                             ((pool_ptr<soul::AST::Constant> *)&local_200);
          ArrayWithPreallocation<soul::Value,4ul>::emplace_back<soul::Value&>
                    ((ArrayWithPreallocation<soul::Value,4ul> *)local_148,&pCVar7->value);
          pFVar8 = (FunctionCall *)
                   &(pFVar8->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                    objectType;
        }
      }
      sVar5 = local_140;
      pCVar6 = pool_ptr<soul::AST::CommaSeparatedList>::operator->(this_00);
      if (sVar5 == (pCVar6->items).numActive) {
        args.e = (Value *)((long)local_148 + local_140 * 0x40);
        args.s = (Value *)local_148;
        performIntrinsic(&local_200,c->targetFunction->intrinsic,args);
        bVar3 = local_200.type.category == invalid;
        pFVar10 = c;
        if (!bVar3) {
          soul::Value::Value(&local_1c0,&local_200);
          pFVar10 = (FunctionCall *)
                    createConstant(this,&(c->super_CallOrCastBase).super_Expression.super_Statement.
                                         super_ASTObject.context,&local_1c0);
          soul::Value::~Value(&local_1c0);
        }
        soul::Value::~Value(&local_200);
      }
      else {
        bVar3 = true;
      }
      ArrayWithPreallocation<soul::Value,_4UL>::clear
                ((ArrayWithPreallocation<soul::Value,_4UL> *)local_148);
      if (!bVar3) {
        return (Expression *)pFVar10;
      }
    }
  }
  ErrorIgnoringRewritingASTVisitor::failIfNotResolved
            (&this->super_ErrorIgnoringRewritingASTVisitor,(Expression *)c);
  return (Expression *)c;
}

Assistant:

AST::Expression& visit (AST::FunctionCall& c) override
        {
            if (c.getNumArguments() != 0)
            {
                auto parameters = c.targetFunction.parameters.begin();
                auto savedIsUsedAsReference = isUsedAsReference;

                for (auto& a : c.arguments->items)
                {
                    auto param = *parameters++;

                    if (param->isResolved())
                    {
                        auto paramType = param->getType();
                        isUsedAsReference = paramType.isReference();

                        if (isUsedAsReference && paramType.isNonConstReference()
                             && AST::isResolvedAsValue (a.get()) && ! a->isAssignable())
                            a->context.throwError (Errors::cannotPassConstAsNonConstRef());

                        replaceExpression (a);
                    }
                }

                isUsedAsReference = savedIsUsedAsReference;

                if (c.targetFunction.isIntrinsic())
                {
                    ArrayWithPreallocation<Value, 4> constantArgs;

                    if (c.arguments != nullptr)
                    {
                        for (auto& arg : c.arguments->items)
                        {
                            if (auto constant = arg->getAsConstant())
                                constantArgs.emplace_back (constant->value);
                            else
                                break;
                        }
                    }

                    if (constantArgs.size() == c.arguments->items.size())
                    {
                        auto result = performIntrinsic (c.targetFunction.intrinsic, constantArgs);

                        if (result.isValid())
                            return createConstant (c.context, std::move (result));
                    }
                }
            }

            failIfNotResolved (c);
            return c;
        }